

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O1

void __thiscall
Js::DiagStackFrame::TryFetchValueAndAddress
          (DiagStackFrame *this,char16 *source,int sourceLength,ResolvedObject *pOutResolvedObj)

{
  code *pcVar1;
  PropertyRecord *pPVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  ReferencedArenaAdapter *pRVar6;
  LocalsWalker *this_00;
  long *plVar7;
  undefined8 uVar8;
  ArenaAllocator *alloc;
  PropertyRecord *local_48;
  PropertyRecord *propRecord;
  undefined1 local_31;
  bool isConst;
  undefined4 extraout_var_00;
  
  if (source == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0xa8,"(source)","source");
    if (!bVar3) goto LAB_008d3fd2;
    *puVar5 = 0;
  }
  if (pOutResolvedObj == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0xa9,"(pOutResolvedObj)","pOutResolvedObj");
    if (!bVar3) {
LAB_008d3fd2:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  propRecord = (PropertyRecord *)pOutResolvedObj;
  iVar4 = (*this->_vptr_DiagStackFrame[10])(this);
  ScriptContext::FindPropertyRecord
            ((ScriptContext *)CONCAT44(extraout_var,iVar4),source,sourceLength,&local_48);
  if (local_48 != (PropertyRecord *)0x0) {
    pRVar6 = DebugManager::GetDiagnosticArena
                       (((ScriptContext *)CONCAT44(extraout_var,iVar4))->threadContext->debugManager
                       );
    alloc = (ArenaAllocator *)0x0;
    if (pRVar6->deleteFlag == false) {
      alloc = pRVar6->arena;
    }
    this_00 = (LocalsWalker *)new<Memory::ArenaAllocator>(0x28,alloc,0x366bee);
    LocalsWalker::LocalsWalker(this_00,this,2);
    local_31 = 0;
    iVar4 = (*(this_00->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[3])
                      (this_00,(ulong)(uint)local_48->pid);
    pPVar2 = propRecord;
    plVar7 = (long *)CONCAT44(extraout_var_00,iVar4);
    *(long **)&propRecord->isNumeric = plVar7;
    if (plVar7 != (long *)0x0) {
      uVar8 = (**(code **)(*plVar7 + 0x10))(plVar7,0);
      pPVar2[1].pid = (int)uVar8;
      pPVar2[1].hash = (int)((ulong)uVar8 >> 0x20);
      *(undefined1 *)&pPVar2[2].hash = local_31;
    }
  }
  return;
}

Assistant:

void DiagStackFrame::TryFetchValueAndAddress(const char16 *source, int sourceLength, Js::ResolvedObject * pOutResolvedObj)
    {
        Assert(source);
        Assert(pOutResolvedObj);

        Js::ScriptContext* scriptContext = this->GetScriptContext();

        Js::PropertyRecord const * propRecord;
        scriptContext->FindPropertyRecord(source, sourceLength, &propRecord);
        if (propRecord != nullptr)
        {
            ArenaAllocator *arena = scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticArena()->Arena();

            Js::IDiagObjectModelWalkerBase * localsWalker = Anew(arena, Js::LocalsWalker, this, Js::FrameWalkerFlags::FW_EnumWithScopeAlso);

            bool isConst = false;
            pOutResolvedObj->address = localsWalker->FindPropertyAddress(propRecord->GetPropertyId(), isConst);
            if (pOutResolvedObj->address != nullptr)
            {
                pOutResolvedObj->obj = pOutResolvedObj->address->GetValue(FALSE);
                pOutResolvedObj->isConst = isConst;
            }
        }

    }